

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O0

int LZ4_compress_HC_extStateHC_fastReset
              (void *state,char *src,char *dst,int srcSize,int dstCapacity,int compressionLevel)

{
  int iVar1;
  size_t alignment;
  int in_ECX;
  limitedOutput_directive in_EDX;
  LZ4HC_CCtx_internal *in_RDI;
  int in_R8D;
  LZ4HC_CCtx_internal *ctx;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  LZ4_streamHC_t *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  LZ4HC_CCtx_internal *ctx_00;
  undefined4 local_4;
  
  ctx_00 = in_RDI;
  alignment = LZ4_streamHC_t_alignment();
  iVar1 = LZ4_isAligned(in_RDI,alignment);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    LZ4_resetStreamHC_fast(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    LZ4HC_init_internal(&in_stack_ffffffffffffffb0->internal_donotuse,
                        (BYTE *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    iVar1 = LZ4_compressBound(in_ECX);
    if (in_R8D < iVar1) {
      local_4 = LZ4HC_compress_generic
                          (ctx_00,(char *)in_RDI,(char *)CONCAT44(in_R8D,in_stack_ffffffffffffffb8),
                           (int *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,1,in_EDX);
    }
    else {
      local_4 = LZ4HC_compress_generic
                          (ctx_00,(char *)in_RDI,(char *)CONCAT44(in_R8D,in_stack_ffffffffffffffb8),
                           (int *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,0,in_EDX);
    }
  }
  return local_4;
}

Assistant:

int LZ4_compress_HC_extStateHC_fastReset (void* state, const char* src, char* dst, int srcSize, int dstCapacity, int compressionLevel)
{
    LZ4HC_CCtx_internal* const ctx = &((LZ4_streamHC_t*)state)->internal_donotuse;
    if (!LZ4_isAligned(state, LZ4_streamHC_t_alignment())) return 0;
    LZ4_resetStreamHC_fast((LZ4_streamHC_t*)state, compressionLevel);
    LZ4HC_init_internal (ctx, (const BYTE*)src);
    if (dstCapacity < LZ4_compressBound(srcSize))
        return LZ4HC_compress_generic (ctx, src, dst, &srcSize, dstCapacity, compressionLevel, limitedOutput);
    else
        return LZ4HC_compress_generic (ctx, src, dst, &srcSize, dstCapacity, compressionLevel, notLimited);
}